

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyLink.h
# Opt level: O3

void __thiscall btMultibodyLink::updateCacheMultiDof(btMultibodyLink *this,btScalar *pq)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  btScalar *pbVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float local_58;
  
  pbVar4 = this->m_jointPos;
  if (pq != (btScalar *)0x0) {
    pbVar4 = pq;
  }
  switch(this->m_jointType) {
  case eRevolute:
    fVar13 = *pbVar4;
    fVar5 = this->m_axes[0].m_topVec.m_floats[0];
    fVar6 = this->m_axes[0].m_topVec.m_floats[1];
    fVar21 = this->m_axes[0].m_topVec.m_floats[2];
    fVar9 = sinf(fVar13 * -0.5);
    fVar9 = fVar9 / SQRT(fVar21 * fVar21 + fVar5 * fVar5 + fVar6 * fVar6);
    fVar8 = this->m_axes[0].m_topVec.m_floats[0] * fVar9;
    uVar1 = *(undefined8 *)(this->m_axes[0].m_topVec.m_floats + 1);
    fVar6 = fVar9 * (float)uVar1;
    fVar9 = fVar9 * (float)((ulong)uVar1 >> 0x20);
    fVar21 = cosf(fVar13 * -0.5);
    fVar13 = (this->m_zeroRotParentToThis).super_btQuadWord.m_floats[3];
    fVar5 = (this->m_zeroRotParentToThis).super_btQuadWord.m_floats[2];
    uVar1 = *(undefined8 *)(this->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    fVar20 = (float)uVar1;
    fVar23 = (float)((ulong)uVar1 >> 0x20);
    fVar12 = (fVar9 * fVar20 + fVar21 * fVar23 + fVar6 * fVar13) - fVar8 * fVar5;
    uVar1 = *(undefined8 *)((this->m_zeroRotParentToThis).super_btQuadWord.m_floats + 1);
    fVar18 = (fVar8 * (float)uVar1 + fVar5 * fVar21 + fVar13 * fVar9) - fVar6 * fVar20;
    fVar19 = (fVar6 * (float)((ulong)uVar1 >> 0x20) + fVar20 * fVar21 + fVar13 * fVar8) -
             fVar9 * fVar23;
    fVar9 = -fVar9 * fVar5 + fVar23 * -fVar6 + (fVar21 * fVar13 - fVar8 * fVar20);
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0] = fVar19;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1] = fVar12;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2] = fVar18;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3] = fVar9;
    fVar13 = (this->m_eVector).m_floats[0];
    uVar1 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar6 = (float)uVar1;
    fVar8 = (float)((ulong)uVar1 >> 0x20);
    fVar20 = -fVar18;
    fVar23 = -fVar19;
    fVar5 = (fVar13 * fVar9 + fVar8 * fVar12) - fVar18 * fVar6;
    fVar21 = (fVar6 * fVar9 + fVar13 * fVar18) - fVar19 * fVar8;
    fVar7 = (fVar9 * fVar8 + fVar19 * fVar6) - fVar12 * fVar13;
    fVar13 = fVar8 * fVar20 + (fVar13 * fVar23 - fVar6 * fVar12);
    fVar8 = fVar5 * fVar18 + fVar23 * fVar7 + -fVar12 * fVar13 + fVar21 * fVar9;
    fVar6 = fVar21 * fVar19 + -fVar12 * fVar5 + fVar20 * fVar13 + fVar7 * fVar9;
    fVar5 = fVar12 * fVar7 + fVar21 * fVar20 + fVar23 * fVar13 + fVar9 * fVar5 +
            (this->m_dVector).m_floats[0];
    uVar1 = *(undefined8 *)((this->m_dVector).m_floats + 1);
    fVar9 = (float)uVar1;
    fVar13 = (float)((ulong)uVar1 >> 0x20);
    goto LAB_001bc123;
  case ePrismatic:
    fVar6 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3];
    fVar5 = (this->m_eVector).m_floats[0];
    fVar21 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1];
    fVar9 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0];
    fVar13 = *pbVar4;
    uVar1 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar23 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    fVar8 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2];
    fVar12 = -fVar8;
    fVar18 = -fVar9;
    fVar19 = (fVar5 * fVar6 + fVar10 * fVar21) - fVar8 * fVar23;
    fVar20 = (fVar23 * fVar6 + fVar8 * fVar5) - fVar9 * fVar10;
    fVar7 = (fVar6 * fVar10 + fVar9 * fVar23) - fVar21 * fVar5;
    fVar23 = fVar10 * fVar12 + (fVar5 * fVar18 - fVar23 * fVar21);
    fVar5 = fVar21 * fVar7 + fVar20 * fVar12 + fVar18 * fVar23 + fVar6 * fVar19 +
            (this->m_dVector).m_floats[0] + this->m_axes[0].m_bottomVec.m_floats[0] * fVar13;
    uVar1 = *(undefined8 *)((this->m_dVector).m_floats + 1);
    fVar8 = (float)uVar1 + fVar19 * fVar8 + fVar18 * fVar7 + -fVar21 * fVar23 + fVar20 * fVar6;
    fVar6 = (float)((ulong)uVar1 >> 0x20) +
            fVar20 * fVar9 + -fVar21 * fVar19 + fVar12 * fVar23 + fVar7 * fVar6;
    uVar1 = *(undefined8 *)(this->m_axes[0].m_bottomVec.m_floats + 1);
    fVar9 = fVar13 * (float)uVar1;
    fVar13 = fVar13 * (float)((ulong)uVar1 >> 0x20);
LAB_001bc123:
    fVar9 = fVar9 + fVar8;
    fVar13 = fVar13 + fVar6;
    break;
  case eSpherical:
    fVar13 = pbVar4[3];
    fVar5 = *pbVar4;
    fVar6 = (this->m_zeroRotParentToThis).super_btQuadWord.m_floats[3];
    fVar21 = (this->m_zeroRotParentToThis).super_btQuadWord.m_floats[2];
    fVar19 = (float)*(undefined8 *)(pbVar4 + 1);
    uVar1 = *(undefined8 *)(this->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    fVar23 = (float)uVar1;
    fVar7 = (float)((ulong)uVar1 >> 0x20);
    fVar20 = (float)((ulong)*(undefined8 *)(pbVar4 + 1) >> 0x20);
    fVar8 = (fVar20 * fVar23 + (fVar19 * fVar6 - fVar13 * fVar7)) - fVar5 * fVar21;
    fVar9 = (this->m_eVector).m_floats[0];
    uVar1 = *(undefined8 *)((this->m_zeroRotParentToThis).super_btQuadWord.m_floats + 1);
    fVar12 = (fVar5 * (float)uVar1 + (fVar6 * fVar20 - fVar21 * fVar13)) - fVar19 * fVar23;
    fVar18 = (fVar19 * (float)((ulong)uVar1 >> 0x20) + (fVar6 * fVar5 - fVar23 * fVar13)) -
             fVar20 * fVar7;
    fVar23 = -fVar20 * fVar21 + fVar7 * -fVar19 + (-fVar13 * fVar6 - fVar23 * fVar5);
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0] = fVar18;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1] = fVar8;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2] = fVar12;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3] = fVar23;
    uVar1 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar5 = (float)uVar1;
    fVar21 = (float)((ulong)uVar1 >> 0x20);
    fVar19 = -fVar12;
    fVar20 = -fVar18;
    fVar13 = (fVar9 * fVar23 + fVar21 * fVar8) - fVar12 * fVar5;
    fVar6 = (fVar5 * fVar23 + fVar9 * fVar12) - fVar18 * fVar21;
    fVar7 = (fVar23 * fVar21 + fVar18 * fVar5) - fVar8 * fVar9;
    fVar21 = fVar21 * fVar19 + (fVar9 * fVar20 - fVar5 * fVar8);
    fVar5 = fVar8 * fVar7 + fVar6 * fVar19 + fVar20 * fVar21 + fVar23 * fVar13 +
            (this->m_dVector).m_floats[0];
    uVar1 = *(undefined8 *)((this->m_dVector).m_floats + 1);
    fVar9 = (float)uVar1 + fVar13 * fVar12 + fVar20 * fVar7 + -fVar8 * fVar21 + fVar6 * fVar23;
    fVar13 = (float)((ulong)uVar1 >> 0x20) +
             fVar6 * fVar18 + -fVar8 * fVar13 + fVar19 * fVar21 + fVar7 * fVar23;
    break;
  case ePlanar:
    fVar13 = this->m_axes[0].m_topVec.m_floats[0];
    fVar5 = this->m_axes[0].m_topVec.m_floats[1];
    fVar6 = this->m_axes[0].m_topVec.m_floats[2];
    fVar21 = *pbVar4;
    fVar9 = sinf(fVar21 * -0.5);
    fVar9 = fVar9 / SQRT(fVar6 * fVar6 + fVar13 * fVar13 + fVar5 * fVar5);
    fVar6 = this->m_axes[0].m_topVec.m_floats[0] * fVar9;
    uVar1 = *(undefined8 *)(this->m_axes[0].m_topVec.m_floats + 1);
    fVar13 = fVar9 * (float)uVar1;
    fVar9 = fVar9 * (float)((ulong)uVar1 >> 0x20);
    fVar5 = cosf(fVar21 * -0.5);
    uVar1 = *(undefined8 *)(this->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    fVar21 = (float)uVar1;
    fVar8 = (float)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)((this->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2);
    fVar12 = (float)uVar1;
    fVar18 = (float)((ulong)uVar1 >> 0x20);
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0] =
         fVar8 * -fVar9 + fVar12 * fVar13 + fVar5 * fVar21 + fVar6 * fVar18;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1] =
         -fVar6 * fVar12 + fVar21 * fVar9 + fVar5 * fVar8 + fVar13 * fVar18;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2] =
         (fVar8 * fVar6 + fVar5 * fVar12 + fVar18 * fVar9) - fVar21 * fVar13;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3] =
         (fVar8 * -fVar13 + fVar5 * fVar18 + fVar21 * -fVar6) - fVar12 * fVar9;
    fVar13 = this->m_axes[0].m_topVec.m_floats[0];
    fVar5 = this->m_axes[0].m_topVec.m_floats[1];
    fVar6 = this->m_axes[0].m_topVec.m_floats[2];
    fVar21 = *pbVar4;
    fVar9 = sinf(fVar21 * -0.5);
    fVar9 = fVar9 / SQRT(fVar6 * fVar6 + fVar13 * fVar13 + fVar5 * fVar5);
    fVar23 = this->m_axes[0].m_topVec.m_floats[1] * fVar9;
    uVar1 = *(undefined8 *)(this->m_axes[0].m_topVec.m_floats + 2);
    fVar13 = this->m_axes[0].m_topVec.m_floats[0];
    fVar18 = cosf(fVar21 * -0.5);
    fVar5 = (float)*(undefined8 *)(pbVar4 + 1);
    fVar6 = (float)((ulong)*(undefined8 *)(pbVar4 + 1) >> 0x20);
    fVar22 = this->m_axes[2].m_bottomVec.m_floats[0] * fVar6 +
             this->m_axes[1].m_bottomVec.m_floats[0] * fVar5;
    local_58 = (float)uVar1;
    local_58 = local_58 * fVar9;
    fVar13 = fVar13 * fVar9;
    uVar1 = *(undefined8 *)(this->m_axes[1].m_bottomVec.m_floats + 1);
    uVar2 = *(undefined8 *)(this->m_axes[2].m_bottomVec.m_floats + 1);
    fVar9 = fVar6 * (float)uVar2 + fVar5 * (float)uVar1;
    fVar7 = fVar6 * (float)((ulong)uVar2 >> 0x20) + fVar5 * (float)((ulong)uVar1 >> 0x20);
    fVar10 = -local_58;
    fVar14 = -fVar13;
    fVar16 = (fVar22 * fVar18 + fVar23 * fVar7) - local_58 * fVar9;
    fVar17 = (fVar9 * fVar18 + local_58 * fVar22) - fVar13 * fVar7;
    uVar1 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar5 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1];
    fVar6 = (this->m_eVector).m_floats[0];
    fVar21 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2];
    fVar24 = (float)uVar1;
    fVar25 = (float)((ulong)uVar1 >> 0x20);
    fVar8 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3];
    fVar12 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0];
    fVar11 = (fVar6 * fVar8 + fVar25 * fVar5) - fVar21 * fVar24;
    fVar15 = (fVar24 * fVar8 + fVar21 * fVar6) - fVar12 * fVar25;
    fVar26 = -fVar21;
    fVar27 = -fVar12;
    fVar19 = (fVar18 * fVar7 + fVar9 * fVar13) - fVar23 * fVar22;
    fVar20 = (fVar8 * fVar25 + fVar12 * fVar24) - fVar5 * fVar6;
    fVar7 = fVar7 * fVar10 + (fVar22 * fVar14 - fVar9 * fVar23);
    fVar6 = fVar25 * fVar26 + (fVar6 * fVar27 - fVar24 * fVar5);
    fVar9 = fVar11 * fVar21 + fVar27 * fVar20 + -fVar5 * fVar6 + fVar15 * fVar8 +
            local_58 * fVar16 + fVar14 * fVar19 + -fVar23 * fVar7 + fVar18 * fVar17;
    fVar13 = fVar15 * fVar12 + -fVar5 * fVar11 + fVar26 * fVar6 + fVar20 * fVar8 +
             fVar13 * fVar17 + -fVar23 * fVar16 + fVar10 * fVar7 + fVar18 * fVar19;
    fVar5 = fVar5 * fVar20 + fVar15 * fVar26 + fVar27 * fVar6 + fVar11 * fVar8 +
            fVar23 * fVar19 + fVar17 * fVar10 + fVar14 * fVar7 + fVar16 * fVar18;
    break;
  case eFixed:
    uVar1 = *(undefined8 *)((this->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2);
    *(undefined8 *)(this->m_cachedRotParentToThis).super_btQuadWord.m_floats =
         *(undefined8 *)(this->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    *(undefined8 *)((this->m_cachedRotParentToThis).super_btQuadWord.m_floats + 2) = uVar1;
    fVar13 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3];
    fVar5 = (this->m_eVector).m_floats[0];
    fVar6 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0];
    fVar21 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1];
    uVar1 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar20 = (float)uVar1;
    fVar7 = (float)((ulong)uVar1 >> 0x20);
    fVar9 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2];
    fVar8 = -fVar9;
    fVar12 = -fVar6;
    fVar18 = (fVar5 * fVar13 + fVar7 * fVar21) - fVar9 * fVar20;
    fVar19 = (fVar20 * fVar13 + fVar9 * fVar5) - fVar6 * fVar7;
    fVar23 = (fVar13 * fVar7 + fVar6 * fVar20) - fVar21 * fVar5;
    fVar20 = fVar7 * fVar8 + (fVar5 * fVar12 - fVar20 * fVar21);
    fVar5 = fVar21 * fVar23 + fVar19 * fVar8 + fVar12 * fVar20 + fVar13 * fVar18 +
            (this->m_dVector).m_floats[0];
    uVar1 = *(undefined8 *)((this->m_dVector).m_floats + 1);
    fVar9 = (float)uVar1 + fVar18 * fVar9 + fVar12 * fVar23 + -fVar21 * fVar20 + fVar19 * fVar13;
    fVar13 = (float)((ulong)uVar1 >> 0x20) +
             fVar19 * fVar6 + -fVar21 * fVar18 + fVar8 * fVar20 + fVar23 * fVar13;
    break;
  default:
    goto switchD_001bb55a_default;
  }
  auVar3._4_4_ = fVar9;
  auVar3._0_4_ = fVar5;
  auVar3._8_4_ = fVar13;
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_cachedRVector).m_floats = auVar3;
switchD_001bb55a_default:
  return;
}

Assistant:

void updateCacheMultiDof(btScalar *pq = 0)
	{
		btScalar *pJointPos = (pq ? pq : &m_jointPos[0]);

		switch(m_jointType)
		{
			case eRevolute:
			{
				m_cachedRotParentToThis = btQuaternion(getAxisTop(0),-pJointPos[0]) * m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			case ePrismatic:
			{
				// m_cachedRotParentToThis never changes, so no need to update
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector) + pJointPos[0] * getAxisBottom(0);

				break;
			}
			case eSpherical:
			{
				m_cachedRotParentToThis = btQuaternion(pJointPos[0], pJointPos[1], pJointPos[2], -pJointPos[3]) * m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			case ePlanar:
			{
				m_cachedRotParentToThis = btQuaternion(getAxisTop(0),-pJointPos[0]) * m_zeroRotParentToThis;				
				m_cachedRVector = quatRotate(btQuaternion(getAxisTop(0),-pJointPos[0]), pJointPos[1] * getAxisBottom(1) + pJointPos[2] * getAxisBottom(2)) + quatRotate(m_cachedRotParentToThis,m_eVector);				

				break;
			}
			case eFixed:
			{
				m_cachedRotParentToThis = m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			default:
			{
				//invalid type
				btAssert(0);
			}
		}
	}